

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util_tests.cpp
# Opt level: O0

void __thiscall util_tests::test_FormatSubVersion::test_method(test_FormatSubVersion *this)

{
  string_view str;
  bool bVar1;
  long in_FS_OFFSET;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  comments2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  comments;
  char *in_stack_fffffffffffffc48;
  lazy_ostream *in_stack_fffffffffffffc50;
  char *in_stack_fffffffffffffc58;
  char (*in_stack_fffffffffffffc60) [9];
  undefined7 in_stack_fffffffffffffc68;
  undefined1 in_stack_fffffffffffffc6f;
  const_string *in_stack_fffffffffffffc70;
  undefined1 *in_stack_fffffffffffffc78;
  string *in_stack_fffffffffffffc80;
  allocator<char> *in_stack_fffffffffffffc88;
  allocator<char> *__a;
  undefined4 in_stack_fffffffffffffc90;
  int in_stack_fffffffffffffc94;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffc98;
  size_t in_stack_fffffffffffffca0;
  char *in_stack_fffffffffffffca8;
  undefined1 local_2ca [2];
  undefined1 local_2c8 [16];
  undefined1 local_2b8 [70];
  undefined1 local_272 [2];
  undefined1 local_270 [16];
  undefined1 local_260 [71];
  allocator<char> local_219;
  undefined8 local_218;
  undefined8 uStack_210;
  undefined8 local_208;
  allocator<char> local_1f1;
  undefined1 local_1f0 [16];
  undefined1 local_1e0 [71];
  allocator<char> local_199 [49];
  lazy_ostream local_168 [4];
  undefined1 local_128 [32];
  lazy_ostream local_108 [4];
  undefined1 local_c8 [32];
  lazy_ostream local_a8 [4];
  undefined1 local_68 [96];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_stack_fffffffffffffc48);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<char_const(&)[9]>
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)CONCAT17(in_stack_fffffffffffffc6f,in_stack_fffffffffffffc68),
             in_stack_fffffffffffffc60);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_stack_fffffffffffffc48);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<char_const(&)[9]>
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)CONCAT17(in_stack_fffffffffffffc6f,in_stack_fffffffffffffc68),
             in_stack_fffffffffffffc60);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffc98,
             (char *)CONCAT44(in_stack_fffffffffffffc94,in_stack_fffffffffffffc90),
             in_stack_fffffffffffffc88);
  std::__cxx11::string::operator_cast_to_basic_string_view
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffffc6f,in_stack_fffffffffffffc68));
  str._M_str = in_stack_fffffffffffffca8;
  str._M_len = in_stack_fffffffffffffca0;
  SanitizeString_abi_cxx11_(str,in_stack_fffffffffffffc94);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)in_stack_fffffffffffffc48,(value_type *)0xc62cd3);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffc48);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffc48);
  std::allocator<char>::~allocator(local_199);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffc58,
               (pointer)in_stack_fffffffffffffc50,(unsigned_long)in_stack_fffffffffffffc48);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffffc48);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffffc88,
               (const_string *)in_stack_fffffffffffffc80,(size_t)in_stack_fffffffffffffc78,
               in_stack_fffffffffffffc70);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_fffffffffffffc50,(char (*) [1])in_stack_fffffffffffffc48);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffc58,
               (pointer)in_stack_fffffffffffffc50,(unsigned_long)in_stack_fffffffffffffc48);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffc98,
               (char *)CONCAT44(in_stack_fffffffffffffc94,in_stack_fffffffffffffc90),
               in_stack_fffffffffffffc88);
    local_218 = 0;
    uStack_210 = 0;
    local_208 = 0;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)in_stack_fffffffffffffc48);
    FormatSubVersion(in_stack_fffffffffffffc80,(int)((ulong)in_stack_fffffffffffffc78 >> 0x20),
                     (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)in_stack_fffffffffffffc70);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffc98,
               (char *)CONCAT44(in_stack_fffffffffffffc94,in_stack_fffffffffffffc90),
               in_stack_fffffffffffffc88);
    in_stack_fffffffffffffc58 = "std::string(\"/Test:9.99.0/\")";
    in_stack_fffffffffffffc50 = local_a8;
    in_stack_fffffffffffffc48 = "FormatSubVersion(\"Test\", 99900, std::vector<std::string>())";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,std::__cxx11::string>
              (local_1e0,local_1f0,0x414,1,2,local_68);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffc48);
    std::allocator<char>::~allocator(&local_219);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffc48);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)in_stack_fffffffffffffc58);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffc48);
    std::allocator<char>::~allocator(&local_1f1);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffffc48);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffc58,
               (pointer)in_stack_fffffffffffffc50,(unsigned_long)in_stack_fffffffffffffc48);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffffc48);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffffc88,
               (const_string *)in_stack_fffffffffffffc80,(size_t)in_stack_fffffffffffffc78,
               in_stack_fffffffffffffc70);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_fffffffffffffc50,(char (*) [1])in_stack_fffffffffffffc48);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffc58,
               (pointer)in_stack_fffffffffffffc50,(unsigned_long)in_stack_fffffffffffffc48);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffc98,
               (char *)CONCAT44(in_stack_fffffffffffffc94,in_stack_fffffffffffffc90),
               in_stack_fffffffffffffc88);
    FormatSubVersion(in_stack_fffffffffffffc80,(int)((ulong)in_stack_fffffffffffffc78 >> 0x20),
                     (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)in_stack_fffffffffffffc70);
    in_stack_fffffffffffffc98 =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_272;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffc98,
               (char *)CONCAT44(in_stack_fffffffffffffc94,in_stack_fffffffffffffc90),
               in_stack_fffffffffffffc88);
    in_stack_fffffffffffffc58 = "std::string(\"/Test:9.99.0(comment1)/\")";
    in_stack_fffffffffffffc50 = local_108;
    in_stack_fffffffffffffc48 = "FormatSubVersion(\"Test\", 99900, comments)";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,std::__cxx11::string>
              (local_260,local_270,0x415,1,2,local_c8);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffc48);
    std::allocator<char>::~allocator((allocator<char> *)local_272);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffc48);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffc48);
    std::allocator<char>::~allocator((allocator<char> *)(local_272 + 1));
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffffc48);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
    in_stack_fffffffffffffc94 = CONCAT13(bVar1,(int3)in_stack_fffffffffffffc94);
  } while (bVar1);
  do {
    __a = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffc58,
               (pointer)in_stack_fffffffffffffc50,(unsigned_long)in_stack_fffffffffffffc48);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffffc48);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)__a,(const_string *)in_stack_fffffffffffffc80,
               (size_t)in_stack_fffffffffffffc78,in_stack_fffffffffffffc70);
    in_stack_fffffffffffffc80 = (string *)boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_fffffffffffffc50,(char (*) [1])in_stack_fffffffffffffc48);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffc58,
               (pointer)in_stack_fffffffffffffc50,(unsigned_long)in_stack_fffffffffffffc48);
    in_stack_fffffffffffffc78 = local_2ca + 1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffc98,
               (char *)CONCAT44(in_stack_fffffffffffffc94,in_stack_fffffffffffffc90),__a);
    FormatSubVersion(in_stack_fffffffffffffc80,(int)((ulong)in_stack_fffffffffffffc78 >> 0x20),
                     (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)in_stack_fffffffffffffc70);
    in_stack_fffffffffffffc70 = (const_string *)local_2ca;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffc98,
               (char *)CONCAT44(in_stack_fffffffffffffc94,in_stack_fffffffffffffc90),__a);
    in_stack_fffffffffffffc58 = "std::string(\"/Test:9.99.0(comment1; Comment2; .,_?@-; )/\")";
    in_stack_fffffffffffffc50 = local_168;
    in_stack_fffffffffffffc48 = "FormatSubVersion(\"Test\", 99900, comments2)";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,std::__cxx11::string>
              (local_2b8,local_2c8,0x416,1,2,local_128);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffc48);
    std::allocator<char>::~allocator((allocator<char> *)local_2ca);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffc48);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffc48);
    std::allocator<char>::~allocator((allocator<char> *)(local_2ca + 1));
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffffc48);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)in_stack_fffffffffffffc58);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)in_stack_fffffffffffffc58);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(test_FormatSubVersion)
{
    std::vector<std::string> comments;
    comments.emplace_back("comment1");
    std::vector<std::string> comments2;
    comments2.emplace_back("comment1");
    comments2.push_back(SanitizeString(std::string("Comment2; .,_?@-; !\"#$%&'()*+/<=>[]\\^`{|}~"), SAFE_CHARS_UA_COMMENT)); // Semicolon is discouraged but not forbidden by BIP-0014
    BOOST_CHECK_EQUAL(FormatSubVersion("Test", 99900, std::vector<std::string>()),std::string("/Test:9.99.0/"));
    BOOST_CHECK_EQUAL(FormatSubVersion("Test", 99900, comments),std::string("/Test:9.99.0(comment1)/"));
    BOOST_CHECK_EQUAL(FormatSubVersion("Test", 99900, comments2),std::string("/Test:9.99.0(comment1; Comment2; .,_?@-; )/"));
}